

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

int ON_Internal_CompareNgonEdge(void *lhs,void *rhs)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = *(uint *)((long)rhs + (ulong)(*(uint *)((long)rhs + 4) < *rhs) * 4);
  uVar2 = *(uint *)((long)lhs + (ulong)(*(uint *)((long)lhs + 4) < *lhs) * 4);
  if (uVar2 < uVar1) {
    return -1;
  }
  iVar3 = 1;
  if (uVar2 <= uVar1) {
    uVar1 = *(uint *)((long)rhs + (ulong)(*rhs <= *(uint *)((long)rhs + 4)) * 4);
    uVar2 = *(uint *)((long)lhs + (ulong)(*lhs <= *(uint *)((long)lhs + 4)) * 4);
    if (uVar2 < uVar1) {
      return -1;
    }
    if (uVar2 <= uVar1) {
      iVar3 = -1;
      if (*(uint *)((long)rhs + 8) <= *(uint *)((long)lhs + 8)) {
        return (int)(*(uint *)((long)rhs + 8) < *(uint *)((long)lhs + 8));
      }
    }
  }
  return iVar3;
}

Assistant:

static int ON_Internal_CompareNgonEdge(
  const void* lhs,
  const void* rhs
)
{
  const int i = (((const unsigned int*)lhs)[0] <= ((const unsigned int*)lhs)[1]) ? 0 : 1;
  const int j = (((const unsigned int*)rhs)[0] <= ((const unsigned int*)rhs)[1]) ? 0 : 1;
  if (((const unsigned int*)lhs)[i] < ((const unsigned int*)rhs)[j])
    return -1;
  if (((const unsigned int*)lhs)[i] > ((const unsigned int*)rhs)[j])
    return 1;
  if (((const unsigned int*)lhs)[1-i] < ((const unsigned int*)rhs)[1-j])
    return -1;
  if (((const unsigned int*)lhs)[1-i] > ((const unsigned int*)rhs)[1-j])
    return 1;
  if (((const unsigned int*)lhs)[2] < ((const unsigned int*)rhs)[2])
    return -1;
  if (((const unsigned int*)lhs)[2] > ((const unsigned int*)rhs)[2])
    return 1;
  return 0;  
}